

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_array_container_lazy_xor
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint16_t *puVar4;
  bitset_container_t *ourbitset;
  bitset_container_t *pbVar5;
  array_container_t *out;
  int size;
  long lVar6;
  
  size = src_2->cardinality + src_1->cardinality;
  if (size < 0x401) {
    out = array_container_create_given_capacity(size);
    *dst = out;
    if (out != (array_container_t *)0x0) {
      array_container_xor(src_1,src_2,out);
    }
  }
  else {
    pbVar5 = bitset_container_from_array(src_1);
    *dst = pbVar5;
    if (pbVar5 != (bitset_container_t *)0x0) {
      iVar2 = src_2->cardinality;
      if ((long)iVar2 != 0) {
        puVar3 = pbVar5->words;
        puVar4 = src_2->array;
        lVar6 = 0;
        do {
          uVar1 = *(ushort *)((long)puVar4 + lVar6);
          puVar3[uVar1 >> 6] = puVar3[uVar1 >> 6] ^ 1L << ((byte)uVar1 & 0x3f);
          lVar6 = lVar6 + 2;
        } while ((long)iVar2 * 2 != lVar6);
      }
      pbVar5->cardinality = -1;
    }
  }
  return 0x400 < size;
}

Assistant:

bool array_array_container_lazy_xor(
    const array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    // upper bound, but probably poor estimate for xor
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL)
            array_container_xor(src_1, src_2, CAST_array(*dst));
        return false;  // not a bitset
    }
    *dst = bitset_container_from_array(src_1);
    bool returnval = true;  // expect a bitset (maybe, for XOR??)
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_flip_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}